

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O1

void __thiscall
ctemplate::SnippetEscape::Modify
          (SnippetEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  _func_int **pp_Var7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  byte *pbVar11;
  long lVar12;
  byte *pbVar13;
  UnclosedSnippetTags unclosed;
  byte abStack_3d [9];
  int local_34;
  
  local_34 = 0;
  abStack_3d[1] = 0;
  abStack_3d[2] = 0;
  abStack_3d[3] = 0;
  abStack_3d[4] = 0;
  abStack_3d[5] = 0;
  pbVar13 = (byte *)in;
  if (0 < (long)inlen) {
    pbVar11 = (byte *)(in + inlen);
    do {
      bVar2 = *pbVar13;
      if (bVar2 < 0x27) {
        if (bVar2 - 9 < 5) {
          if (in < pbVar13) {
            (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar13 - (long)in);
          }
          pp_Var7 = out->_vptr_ExpandEmitter;
          uVar9 = 1;
          pcVar6 = " ";
        }
        else if (bVar2 == 0x22) {
          if (in < pbVar13) {
            (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar13 - (long)in);
          }
          pp_Var7 = out->_vptr_ExpandEmitter;
          uVar9 = 6;
          pcVar6 = "&quot;";
        }
        else {
          if (bVar2 != 0x26) goto LAB_0012af96;
          if (in < pbVar13) {
            (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar13 - (long)in);
          }
          if ((pbVar13 + 1 < pbVar11) && (pbVar13[1] == 0x7b)) {
            pp_Var7 = out->_vptr_ExpandEmitter;
            uVar9 = 5;
            pcVar6 = "&amp;";
          }
          else {
            pp_Var7 = out->_vptr_ExpandEmitter;
            uVar9 = 1;
            pcVar6 = "&";
          }
        }
        goto LAB_0012afc7;
      }
      if (bVar2 == 0x3c) {
        pbVar1 = pbVar13 + 1;
        iVar10 = (int)pbVar11 - (int)pbVar1;
        if (iVar10 < 2) {
LAB_0012adfa:
          if (((2 < iVar10) && (pbVar13[3] == 0x3e && *(short *)pbVar1 == 0x6d65)) &&
             (pcVar6 = strchr((char *)(abStack_3d + 1),0x65), pcVar6 == (char *)0x0)) {
            lVar8 = (long)local_34;
            local_34 = local_34 + 1;
            abStack_3d[lVar8 + 1] = 0x65;
LAB_0012b140:
            pbVar13 = pbVar13 + 4;
            goto LAB_0012b15b;
          }
          if ((((0xc < iVar10) && (pbVar13[9] == 0x3d && *(long *)pbVar1 == 0x726964206e617073)) &&
              ((*(int *)(pbVar13 + 10) == 0x3e72746c || (*(int *)(pbVar13 + 10) == 0x3e6c7472)))) &&
             (pcVar6 = strchr((char *)(abStack_3d + 1),0x73), pcVar6 == (char *)0x0)) {
            lVar8 = (long)local_34;
            local_34 = local_34 + 1;
            abStack_3d[lVar8 + 1] = 0x73;
            pbVar13 = pbVar13 + 0xe;
            goto LAB_0012b15b;
          }
          if (2 < iVar10) {
            if ((pbVar13[3] == 0x3e && *(short *)pbVar1 == 0x622f) &&
               (pcVar6 = strchr((char *)(abStack_3d + 1),0x62), pcVar6 != (char *)0x0)) {
              cVar3 = *pcVar6;
              pcVar5 = pcVar6;
              while (cVar3 != '\0') {
                cVar3 = pcVar5[1];
                *pcVar5 = cVar3;
                pcVar5 = pcVar5 + 1;
              }
              local_34 = local_34 + -1;
              if (pcVar6 != (char *)0x0) goto LAB_0012b140;
            }
            if ((pbVar13[3] == 0x3e && *(short *)pbVar1 == 0x692f) &&
               (pcVar6 = strchr((char *)(abStack_3d + 1),0x69), pcVar6 != (char *)0x0)) {
              cVar3 = *pcVar6;
              pcVar5 = pcVar6;
              while (cVar3 != '\0') {
                cVar3 = pcVar5[1];
                *pcVar5 = cVar3;
                pcVar5 = pcVar5 + 1;
              }
              local_34 = local_34 + -1;
              if (pcVar6 != (char *)0x0) goto LAB_0012b140;
            }
          }
          if (((3 < iVar10) && (*(int *)pbVar1 == 0x3e6d652f)) &&
             (pcVar6 = strchr((char *)(abStack_3d + 1),0x65), pcVar6 != (char *)0x0)) {
            cVar3 = *pcVar6;
            pcVar5 = pcVar6;
            while (cVar3 != '\0') {
              cVar3 = pcVar5[1];
              *pcVar5 = cVar3;
              pcVar5 = pcVar5 + 1;
            }
            local_34 = local_34 + -1;
            if (pcVar6 == (char *)0x0) goto LAB_0012aea4;
LAB_0012b098:
            pbVar13 = pbVar13 + 5;
            goto LAB_0012b15b;
          }
LAB_0012aea4:
          if (((5 < iVar10) && (*(short *)(pbVar13 + 5) == 0x3e6e && *(int *)pbVar1 == 0x6170732f))
             && (pcVar6 = strchr((char *)(abStack_3d + 1),0x73), pcVar6 != (char *)0x0)) {
            cVar3 = *pcVar6;
            pcVar5 = pcVar6;
            while (cVar3 != '\0') {
              cVar3 = pcVar5[1];
              *pcVar5 = cVar3;
              pcVar5 = pcVar5 + 1;
            }
            local_34 = local_34 + -1;
            if (pcVar6 != (char *)0x0) {
              pbVar13 = pbVar13 + 7;
              goto LAB_0012b15b;
            }
          }
          if ((2 < iVar10) && (pbVar13[3] == 0x3e && *(short *)pbVar1 == 0x7262)) goto LAB_0012b140;
          if ((3 < iVar10) && (*(int *)pbVar1 == 0x3e726277)) goto LAB_0012b098;
          if (in < pbVar13) {
            (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar13 - (long)in);
          }
          (*out->_vptr_ExpandEmitter[5])(out,"&lt;",4);
          bVar4 = false;
        }
        else {
          if ((*(short *)pbVar1 == 0x3e62) &&
             (pcVar6 = strchr((char *)(abStack_3d + 1),0x62), pcVar6 == (char *)0x0)) {
            lVar8 = (long)local_34;
            local_34 = local_34 + 1;
            abStack_3d[lVar8 + 1] = 0x62;
          }
          else {
            if ((*(short *)pbVar1 != 0x3e69) ||
               (pcVar6 = strchr((char *)(abStack_3d + 1),0x69), pcVar6 != (char *)0x0))
            goto LAB_0012adfa;
            lVar8 = (long)local_34;
            local_34 = local_34 + 1;
            abStack_3d[lVar8 + 1] = 0x69;
          }
          pbVar13 = pbVar13 + 3;
LAB_0012b15b:
          bVar4 = true;
        }
        if (!bVar4) {
LAB_0012afca:
          in = (char *)(pbVar13 + 1);
          pbVar13 = (byte *)in;
        }
      }
      else {
        if (bVar2 == 0x27) {
          if (in < pbVar13) {
            (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar13 - (long)in);
          }
          pp_Var7 = out->_vptr_ExpandEmitter;
          uVar9 = 5;
          pcVar6 = "&#39;";
LAB_0012afc7:
          (*pp_Var7[5])(out,pcVar6,uVar9);
          goto LAB_0012afca;
        }
        if (bVar2 == 0x3e) {
          if (in < pbVar13) {
            (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar13 - (long)in);
          }
          pp_Var7 = out->_vptr_ExpandEmitter;
          uVar9 = 4;
          pcVar6 = "&gt;";
          goto LAB_0012afc7;
        }
LAB_0012af96:
        pbVar13 = pbVar13 + 1;
      }
    } while (pbVar13 < pbVar11);
  }
  if (in < pbVar13) {
    (*out->_vptr_ExpandEmitter[5])(out,in,(long)pbVar13 - (long)in);
  }
  if (-1 < (long)local_34) {
    lVar8 = (long)local_34 + 1;
    do {
      bVar2 = abStack_3d[lVar8];
      if (bVar2 < 0x69) {
        pcVar6 = "</b>";
        if (bVar2 == 0x62) goto LAB_0012b286;
        if (bVar2 == 0x65) {
          pcVar6 = "</em>";
          goto LAB_0012b286;
        }
      }
      else {
        if (bVar2 == 0x73) {
          pcVar6 = "</span>";
        }
        else {
          if (bVar2 != 0x69) goto LAB_0012b28f;
          pcVar6 = "</i>";
        }
LAB_0012b286:
        (*out->_vptr_ExpandEmitter[4])(out,pcVar6);
      }
LAB_0012b28f:
      lVar12 = lVar8 + -1;
      bVar4 = 0 < lVar8;
      lVar8 = lVar12;
    } while (lVar12 != 0 && bVar4);
  }
  return;
}

Assistant:

void SnippetEscape::Modify(const char* in, size_t inlen,
                           const PerExpandData*,
                           ExpandEmitter* out, const string& arg) const {
  UnclosedSnippetTags unclosed;
  const char* pos = in;
  const char* start = pos;
  const char* const limit = in + inlen;
  while (pos < limit) {
    switch (*pos) {
      default:
        // Increment our counter and look at the next character.
        ++pos;
        continue;

      case '<': {
        // If there is a permissible tag, just advance pos past it to
        // make it part of the current run.  Notice the use of
        // "continue" below.
        const char* const next_pos = pos + 1;
        const int chars_left = limit - next_pos;
        if ((chars_left >= 2) && !memcmp(next_pos, "b>", 2)
            && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_B)) {
          pos += strliterallen("<b>");
          continue;
        } else if ((chars_left >= 2) && !memcmp(next_pos, "i>", 2)
                   && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_I)) {
          pos += strliterallen("<i>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "em>", 3)
                   && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_EM)) {
          pos += strliterallen("<em>");
          continue;
        } else if ((chars_left >= 13) && !memcmp(next_pos, "span dir=", 9)
                   && (!memcmp(next_pos + 9, "ltr>", 4) ||
                       !memcmp(next_pos + 9, "rtl>", 4))
                   && unclosed.MaybeAdd(UnclosedSnippetTags::TAG_SPAN)) {
          pos += strliterallen("<span dir=ltr>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "/b>", 3)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_B)) {
          pos += strliterallen("</b>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "/i>", 3)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_I)) {
          pos += strliterallen("</i>");
          continue;
        } else if ((chars_left >= 4) && !memcmp(next_pos, "/em>", 4)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_EM)) {
          pos += strliterallen("</em>");
          continue;
        } else if ((chars_left >= 6) && !memcmp(next_pos, "/span>", 6)
                   && unclosed.MaybeRemove(UnclosedSnippetTags::TAG_SPAN)) {
          pos += strliterallen("</span>");
          continue;
        } else if ((chars_left >= 3) && !memcmp(next_pos, "br>", 3)) {
          pos += strliterallen("<br>");
          continue;
        } else if ((chars_left >= 4) && !memcmp(next_pos, "wbr>", 4)) {
          pos += strliterallen("<wbr>");
          continue;
        }

        // Emit the entity and break out of the switch.
        EmitRun(start, pos, out);
        APPEND("&lt;");
        break;
      }

      case '&':
        EmitRun(start, pos, out);
        if (pos + 1 < limit && pos[1] == '{') {
          // Could be a javascript entity, so we need to escape.
          // (Javascript entities are an xss risk in Netscape 4.)
          APPEND("&amp;");
        } else {
          APPEND("&");
        }
        break;

      case '"':  EmitRun(start, pos, out); APPEND("&quot;"); break;
      case '\'': EmitRun(start, pos, out); APPEND("&#39;");  break;
      case '>':  EmitRun(start, pos, out); APPEND("&gt;");   break;

      case '\r': case '\n': case '\v': case '\f': case '\t':
        // non-space whitespace
        EmitRun(start, pos, out); APPEND(" "); break;

    }
    start = ++pos;
  }
  EmitRun(start, pos, out);
  unclosed.PrintClosingTags(out);
}